

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

ValueLength ReadVariableLengthValue<false>(uint8_t **p,uint8_t *end)

{
  byte *ptr;
  byte bVar1;
  undefined1 uVar2;
  Options *pOVar3;
  ValueLength VVar4;
  int64_t iVar5;
  ValueLength VVar6;
  Exception *this;
  ulong uVar7;
  byte *pbVar8;
  Options *pOVar9;
  size_t actual;
  char *msg;
  byte *pbVar10;
  byte *pbStack_60;
  Validator *pVStack_58;
  byte *pbStack_50;
  byte *pbStack_48;
  
  uVar7 = 0;
  VVar4 = 0;
  pbVar10 = *p;
  while( true ) {
    pbVar8 = pbVar10 + 1;
    bVar1 = *pbVar10;
    VVar4 = ((ulong)(bVar1 & 0x7f) << ((byte)uVar7 & 0x3f)) + VVar4;
    *p = pbVar8;
    if (-1 < (char)bVar1) {
      return VVar4;
    }
    if ((pbVar8 == end) || (0x31 < uVar7)) break;
    uVar7 = uVar7 + 7;
    pbVar10 = pbVar8;
    if (-1 < (char)bVar1) {
      return VVar4;
    }
  }
  ReadVariableLengthValue<false>();
  uVar7 = 0;
  VVar4 = 0;
  pOVar3 = ((Validator *)p)->options;
  while( true ) {
    pOVar9 = (Options *)((long)&pOVar3[-1].nestingLimit + 3);
    uVar2 = (undefined1)pOVar3->unsupportedTypeBehavior;
    VVar4 = ((ulong)((byte)uVar2 & 0x7f) << ((byte)uVar7 & 0x3f)) + VVar4;
    ((Validator *)p)->options = pOVar9;
    if (-1 < (char)uVar2) {
      return VVar4;
    }
    if ((pOVar9 == (Options *)end) || (0x31 < uVar7)) break;
    uVar7 = uVar7 + 7;
    pOVar3 = pOVar9;
    if (-1 < (char)uVar2) {
      return VVar4;
    }
  }
  ReadVariableLengthValue<true>();
  pVStack_58 = (Validator *)p;
  arangodb::velocypack::Validator::validateBufferLength((Validator *)p,5,actual,true);
  pbStack_60 = (byte *)((long)&((Options *)end)->unsupportedTypeBehavior + 1);
  VVar4 = ReadVariableLengthValue<false>
                    (&pbStack_60,
                     (uint8_t *)((long)&((Options *)end)->unsupportedTypeBehavior + actual + 1));
  pbVar10 = pbStack_60;
  if ((VVar4 <= actual) && (4 < VVar4)) {
    pbStack_60 = (byte *)((long)end + (VVar4 - 1));
    VVar4 = ReadVariableLengthValue<true>
                      (&pbStack_60,
                       (uint8_t *)((long)&((Options *)end)->unsupportedTypeBehavior + VVar4));
    if (VVar4 != 0) {
      pbVar8 = pbStack_60 + 1;
      pbStack_60 = pbVar10;
      do {
        if (pbVar8 <= pbVar10) {
          pbStack_60 = pbVar10;
          this = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Object items number is out of bounds";
          goto LAB_00104a19;
        }
        arangodb::velocypack::Validator::validatePart
                  (pVStack_58,pbVar10,(long)pbVar8 - (long)pbVar10,true);
        bVar1 = *pbVar10;
        pbStack_50 = pbVar10;
        if (0x7f < (ulong)bVar1 - 0x40) {
          if ((bVar1 & 0xf0) == 0x30) {
            iVar5 = arangodb::velocypack::
                    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getSmallInt
                              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                *)&pbStack_50);
            if (iVar5 < 1) {
LAB_00104a00:
              pbStack_60 = pbVar10;
              this = (Exception *)__cxa_allocate_exception(0x18);
              msg = "Invalid object key type";
              goto LAB_00104a19;
            }
          }
          else if ((bVar1 & 0xf8) != 0x28) goto LAB_00104a00;
        }
        VVar6 = (ValueLength)"\x01\x01"[*pbStack_50];
        if (VVar6 == 0) {
          VVar6 = arangodb::velocypack::
                  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_50,pbStack_50);
        }
        if (((ulong)bVar1 - 0x40 < 0x80) && (pVStack_58->options->validateUtf8Strings == true)) {
          arangodb::velocypack::Validator::validatePart(pVStack_58,pbVar10,VVar6,true);
        }
        ptr = pbVar10 + VVar6;
        arangodb::velocypack::Validator::validatePart(pVStack_58,ptr,(long)pbVar8 - (long)ptr,true);
        VVar6 = (ValueLength)"\x01\x01"[pbVar10[VVar6]];
        pbStack_48 = ptr;
        if (VVar6 == 0) {
          VVar6 = arangodb::velocypack::
                  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_48,ptr);
        }
        VVar4 = VVar4 - 1;
        pbVar10 = ptr + VVar6;
      } while (VVar4 != 0);
      if (pbVar10 == pbVar8) {
        return VVar6;
      }
      pbStack_60 = pbVar10;
      this = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Object has more members than specified";
      goto LAB_00104a19;
    }
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  msg = "Object length value is out of bounds";
LAB_00104a19:
  arangodb::velocypack::Exception::Exception(this,ValidatorInvalidLength,msg);
  __cxa_throw(this,&arangodb::velocypack::Exception::typeinfo,
              arangodb::velocypack::Exception::~Exception);
}

Assistant:

static ValueLength ReadVariableLengthValue(uint8_t const*& p,
                                           uint8_t const* end) {
  ValueLength value = 0;
  ValueLength shifter = 0;
  while (true) {
    uint8_t c = *p;
    VELOCYPACK_ASSERT(shifter <= 8 * 7);
    value += static_cast<ValueLength>(c & 0x7fU) << shifter;
    shifter += 7;
    if (reverse) {
      --p;
    } else {
      ++p;
    }
    if (!(c & 0x80U)) {
      break;
    }
    if (VELOCYPACK_UNLIKELY(p == end || shifter > 7 * 8)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Compound value length value is out of bounds");
    }
  }
  return value;
}